

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 *len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int local_148;
  int found;
  PHYSFS_sint32 totalread;
  PHYSFS_sint32 maxread;
  PHYSFS_sint64 filepos;
  PHYSFS_sint64 filelen;
  PHYSFS_sint32 i;
  PHYSFS_uint8 extra [4];
  PHYSFS_uint8 buf [256];
  PHYSFS_sint64 *len_local;
  PHYSFS_Io *io_local;
  
  memset((void *)((long)&filelen + 4),0,4);
  filelen._0_4_ = 0;
  local_148 = 0;
  bVar1 = false;
  uVar4 = (*io->length)(io);
  if (uVar4 == 0xffffffffffffffff) {
    io_local = (PHYSFS_Io *)0xffffffffffffffff;
  }
  else {
    if (uVar4 < 0x101) {
      _totalread = 0;
      found = (int)uVar4;
    }
    else {
      _totalread = uVar4 - 0x100;
      found = 0x100;
    }
    while ((long)local_148 < (long)uVar4 && local_148 < 0x10015) {
      iVar2 = (*io->seek)(io,_totalread);
      if (iVar2 == 0) {
        return -1;
      }
      if (local_148 == 0) {
        iVar3 = __PHYSFS_readAll(io,&i,(long)found);
        iVar2 = found;
        if (iVar3 == 0) {
          return -1;
        }
      }
      else {
        iVar2 = __PHYSFS_readAll(io,&i,(long)(found + -4));
        if (iVar2 == 0) {
          return -1;
        }
        *(PHYSFS_sint32 *)(extra + (long)(found + -4) + -4) = filelen._4_4_;
        iVar2 = found + -4;
      }
      local_148 = iVar2 + local_148;
      filelen._4_4_ = i;
      for (filelen._0_4_ = found + -4; 0 < (int)filelen; filelen._0_4_ = (int)filelen + -1) {
        if ((((extra[(long)(int)filelen + -4] == 'P') &&
             (extra[(long)((int)filelen + 1) + -4] == 'K')) &&
            (extra[(long)((int)filelen + 2) + -4] == '\x05')) &&
           (extra[(long)((int)filelen + 3) + -4] == '\x06')) {
          bVar1 = true;
          break;
        }
      }
      if (bVar1) break;
      _totalread = _totalread - (long)(found + -4);
      if ((long)_totalread < 0) {
        _totalread = 0;
      }
    }
    if (bVar1) {
      if (len != (PHYSFS_sint64 *)0x0) {
        *len = uVar4;
      }
      io_local = (PHYSFS_Io *)(_totalread + (long)(int)filelen);
    }
    else {
      PHYSFS_setErrorCode(PHYSFS_ERR_UNSUPPORTED);
      io_local = (PHYSFS_Io *)0xffffffffffffffff;
    }
  }
  return (PHYSFS_sint64)io_local;
}

Assistant:

static PHYSFS_sint64 zip_find_end_of_central_dir(PHYSFS_Io *io, PHYSFS_sint64 *len)
{
    PHYSFS_uint8 buf[256];
    PHYSFS_uint8 extra[4] = { 0, 0, 0, 0 };
    PHYSFS_sint32 i = 0;
    PHYSFS_sint64 filelen;
    PHYSFS_sint64 filepos;
    PHYSFS_sint32 maxread;
    PHYSFS_sint32 totalread = 0;
    int found = 0;

    filelen = io->length(io);
    BAIL_IF_ERRPASS(filelen == -1, -1);

    /*
     * Jump to the end of the file and start reading backwards.
     *  The last thing in the file is the zipfile comment, which is variable
     *  length, and the field that specifies its size is before it in the
     *  file (argh!)...this means that we need to scan backwards until we
     *  hit the end-of-central-dir signature. We can then sanity check that
     *  the comment was as big as it should be to make sure we're in the
     *  right place. The comment length field is 16 bits, so we can stop
     *  searching for that signature after a little more than 64k at most,
     *  and call it a corrupted zipfile.
     */

    if (sizeof (buf) < filelen)
    {
        filepos = filelen - sizeof (buf);
        maxread = sizeof (buf);
    } /* if */
    else
    {
        filepos = 0;
        maxread = (PHYSFS_uint32) filelen;
    } /* else */

    while ((totalread < filelen) && (totalread < 65557))
    {
        BAIL_IF_ERRPASS(!io->seek(io, filepos), -1);

        /* make sure we catch a signature between buffers. */
        if (totalread != 0)
        {
            if (!__PHYSFS_readAll(io, buf, maxread - 4))
                return -1;
            memcpy(&buf[maxread - 4], &extra, sizeof (extra));
            totalread += maxread - 4;
        } /* if */
        else
        {
            if (!__PHYSFS_readAll(io, buf, maxread))
                return -1;
            totalread += maxread;
        } /* else */

        memcpy(&extra, buf, sizeof (extra));

        for (i = maxread - 4; i > 0; i--)
        {
            if ((buf[i + 0] == 0x50) &&
                (buf[i + 1] == 0x4B) &&
                (buf[i + 2] == 0x05) &&
                (buf[i + 3] == 0x06) )
            {
                found = 1;  /* that's the signature! */
                break;  
            } /* if */
        } /* for */

        if (found)
            break;

        filepos -= (maxread - 4);
        if (filepos < 0)
            filepos = 0;
    } /* while */

    BAIL_IF(!found, PHYSFS_ERR_UNSUPPORTED, -1);

    if (len != NULL)
        *len = filelen;

    return (filepos + i);
}